

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_group_ops(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  _func_int *p_Var3;
  long *plVar4;
  long lVar5;
  int *piVar6;
  Allocator *pAVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 *puVar11;
  void **ppvVar12;
  _func_int ***ppp_Var13;
  int i;
  uint uVar14;
  pointer ppLVar15;
  Layer *pLVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  pointer ppLVar20;
  void *in_R8;
  void *pvVar21;
  _func_int **pp_Var22;
  long lVar23;
  bool bVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ParamDict pd;
  Mat local_2b8;
  undefined1 auStack_270 [12];
  int local_264;
  int local_260;
  int local_25c;
  undefined1 local_258 [44];
  int iStack_22c;
  undefined8 uStack_228;
  int local_220 [2];
  size_t local_218;
  void *local_210;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  int iStack_1f8;
  Allocator *local_1f0;
  uint local_1e8;
  int iStack_1e4;
  undefined8 uStack_1e0;
  uint local_1d8;
  size_t local_1d0;
  _func_int **local_1c8;
  int *piStack_1c0;
  long lStack_1b8;
  int iStack_1b0;
  Allocator *local_1a8;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  int local_190;
  size_t local_188;
  void *local_180;
  int *piStack_178;
  long lStack_170;
  undefined4 uStack_168;
  long *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined8 local_140;
  void *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  long *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined8 local_f8;
  Mat local_e8;
  undefined8 *local_a0;
  void **local_98;
  int *local_90;
  _func_int ***local_88;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_80;
  size_t local_78;
  Allocator *local_70;
  long local_68;
  size_t local_60;
  undefined1 *local_58;
  size_t local_50;
  Option *local_48;
  ParamDict local_40;
  
  ppLVar20 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar19 = *(int *)(&this->field_0xd8 + (long)p_Var3) * *(int *)(&this->field_0xd4 + (long)p_Var3);
  iVar25 = *(int *)(&this->field_0xd0 + (long)p_Var3);
  iVar26 = *(int *)(&this->field_0x108 + (long)p_Var3);
  uVar18 = (long)*(int *)(&this->field_0x104 + (long)p_Var3) / (long)iVar26;
  uVar18 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) / (long)iVar19;
  ppLVar15 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_48 = opt;
  if (0 < (int)((ulong)((long)ppLVar15 - (long)ppLVar20) >> 3)) {
    lVar23 = 0;
    do {
      if (ppLVar20[lVar23] != (Layer *)0x0) {
        (*ppLVar20[lVar23]->_vptr_Layer[1])();
      }
      lVar23 = lVar23 + 1;
      ppLVar20 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar15 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar23 < (int)((ulong)((long)ppLVar15 - (long)ppLVar20) >> 3));
  }
  local_80 = &this->group_ops;
  if (ppLVar15 != ppLVar20) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar20;
  }
  iVar2 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) / iVar2;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_80,(long)iVar2);
  pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
  if (0 < *(int *)(&this->field_0x108 + (long)pp_Var22[-3])) {
    local_58 = &this->field_0x118;
    local_25c = iVar19 * i *
                (((int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                       (long)(iVar25 / iVar26)) * iVar26) / iVar2);
    local_50 = (size_t)local_25c;
    local_60 = (size_t)i;
    local_88 = &local_1c8;
    local_90 = &local_1a0;
    local_98 = &local_180;
    local_a0 = &local_158;
    lVar23 = 0;
    do {
      p_Var3 = pp_Var22[-3];
      lVar17 = *(long *)(&this->field_0x178 + (long)p_Var3);
      local_258._0_8_ = lVar23 * local_50 * lVar17 + *(long *)(&this->field_0x168 + (long)p_Var3);
      local_258._24_4_ = *(undefined4 *)(&this->field_0x180 + (long)p_Var3);
      local_258._32_8_ = *(undefined8 *)(&this->field_0x188 + (long)p_Var3);
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_4_ = (undefined4)lVar17;
      local_258._20_4_ = (undefined4)((ulong)lVar17 >> 0x20);
      iStack_22c = (int)local_50;
      local_258._40_4_ = 1;
      uStack_228._0_4_ = 1;
      uStack_228._4_4_ = 1;
      local_220[0] = 1;
      local_218 = local_50;
      Mat::clone(&local_e8,(__fn *)local_258,(void *)0x0,1,in_R8);
      piVar6 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
            if ((void *)local_258._0_8_ != (void *)0x0) {
              free((void *)local_258._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_258._32_8_)[3])();
          }
        }
      }
      local_218 = 0;
      local_258._0_8_ = (void *)0x0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._24_4_ = 0;
      stack0xfffffffffffffdd0 = ZEXT816(0);
      local_220[0] = 0;
      p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
      bVar24 = *(int *)(&this->field_0x100 + (long)p_Var3) == 0;
      if (bVar24) {
        pvVar21 = (void *)0x0;
        local_68 = 0;
        local_260 = 0;
        local_70 = (Allocator *)0x0;
        local_264 = 0;
        local_78 = 0;
      }
      else {
        local_68 = *(long *)(&this->field_0x1c0 + (long)p_Var3);
        pvVar21 = (void *)(lVar23 * local_60 * local_68 +
                          *(long *)(&this->field_0x1b0 + (long)p_Var3));
        local_260 = *(int *)(&this->field_0x1c8 + (long)p_Var3);
        local_70 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var3);
        local_78 = local_60;
        local_264 = i;
      }
      bVar24 = !bVar24;
      uVar14 = (uint)bVar24;
      pLVar16 = create_layer(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,
                     *(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,0xb,
                     *(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,2,
                     *(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,0xc,
                     *(int *)(&this->field_0xe0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,3,
                     *(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,0xd,
                     *(int *)(&this->field_0xe8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,
                     *(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,6,local_25c);
      ParamDict::set(&local_40,8,
                     *(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,9,
                     *(int *)(&this->field_0x110 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]));
      ParamDict::set(&local_40,10,(Mat *)(local_58 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                    );
      (*pLVar16->_vptr_Layer[2])(pLVar16,&local_40);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) == 0) {
        lVar17 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar17) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x28) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x20) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x1c) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x14) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -8) = 0;
          *(undefined8 *)(auStack_270 + lVar17) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + 4) = 0;
          *(undefined8 *)((long)&local_264 + lVar17) = 0;
          lVar17 = lVar17 + 0x48;
        } while (lVar17 != 0x160);
        piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8.data;
        local_258._8_4_ = local_e8.refcount._0_4_;
        local_258._12_4_ = local_e8.refcount._4_4_;
        local_258._16_4_ = (undefined4)local_e8.elemsize;
        local_258._20_4_ = local_e8.elemsize._4_4_;
        local_258._24_4_ = local_e8.elempack;
        local_258._32_8_ = local_e8.allocator;
        uStack_228._0_4_ = local_e8.h;
        local_258._40_4_ = local_e8.dims;
        iStack_22c = local_e8.w;
        uStack_228._4_4_ = local_e8.d;
        local_220[0] = local_e8.c;
        local_218 = local_e8.cstep;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) != 0) {
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
          local_2b8.allocator = (Allocator *)0x0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_0054cf10;
          auVar9 = _DAT_0054cf00;
          auVar8 = _DAT_0054ce00;
          uVar14 = local_2b8.c * (int)local_2b8.cstep;
          if (0 < (int)uVar14) {
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                     + lVar23 * 4);
            lVar17 = (ulong)uVar14 - 1;
            auVar30._8_4_ = (int)lVar17;
            auVar30._0_8_ = lVar17;
            auVar30._12_4_ = (int)((ulong)lVar17 >> 0x20);
            auVar30 = auVar30 ^ _DAT_0054ce00;
            uVar18 = 0;
            do {
              auVar28._8_4_ = (int)uVar18;
              auVar28._0_8_ = uVar18;
              auVar28._12_4_ = (int)(uVar18 >> 0x20);
              auVar29 = (auVar28 | auVar10) ^ auVar8;
              iVar25 = auVar30._0_4_;
              bVar24 = iVar25 < auVar29._0_4_;
              iVar26 = auVar30._4_4_;
              iVar19 = auVar29._4_4_;
              if ((bool)(~(iVar26 < iVar19 || iVar19 == iVar26 && bVar24) & 1)) {
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4) = uVar1;
              }
              if (iVar26 >= iVar19 && (iVar19 != iVar26 || !bVar24)) {
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4 + 4) = uVar1;
              }
              auVar28 = (auVar28 | auVar9) ^ auVar8;
              iVar19 = auVar28._4_4_;
              if (iVar19 <= iVar26 && (iVar19 != iVar26 || auVar28._0_4_ <= iVar25)) {
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4 + 8) = uVar1;
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4 + 0xc) = uVar1;
              }
              uVar18 = uVar18 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar18);
          }
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = (int *)CONCAT44(uStack_204,uStack_208);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_1f0 == (Allocator *)0x0) {
                if (local_210 != (void *)0x0) {
                  free(local_210);
                }
              }
              else {
                (*local_1f0->_vptr_Allocator[3])();
              }
            }
          }
          local_210 = local_2b8.data;
          uStack_208 = local_2b8.refcount._0_4_;
          uStack_204 = local_2b8.refcount._4_4_;
          uStack_200 = (undefined4)local_2b8.elemsize;
          uStack_1fc = local_2b8.elemsize._4_4_;
          iStack_1f8 = local_2b8.elempack;
          local_1f0 = local_2b8.allocator;
          _local_1e8 = CONCAT44(local_2b8.w,local_2b8.dims);
          uStack_1e0 = CONCAT44(local_2b8.d,local_2b8.h);
          local_1d8 = local_2b8.c;
          local_1d0 = local_2b8.cstep;
          p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar17 = *(long *)(&this->field_0x250 + (long)p_Var3);
          pp_Var22 = (_func_int **)(lVar17 * lVar23 + *(long *)(&this->field_0x240 + (long)p_Var3));
          iVar25 = *(int *)(&this->field_0x258 + (long)p_Var3);
          pAVar7 = *(Allocator **)(&this->field_0x260 + (long)p_Var3);
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (_func_int **)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var13 = local_88;
          *(undefined8 *)((long)local_88 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var13 + 0x14) = 0;
          *ppp_Var13 = (_func_int **)0x0;
          ppp_Var13[1] = (_func_int **)0x0;
          piVar6 = local_90;
          piVar6[0] = 0;
          piVar6[1] = 0;
          piVar6[2] = 0;
          piVar6[3] = 0;
          piVar6[4] = 0;
          piStack_1c0 = (int *)0x0;
          local_1a0 = 1;
          iStack_19c = 1;
          iStack_198 = 1;
          iStack_194 = 1;
          local_190 = 1;
          local_188 = 1;
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          local_1c8 = pp_Var22;
          lStack_1b8 = lVar17;
          iStack_1b0 = iVar25;
          local_1a8 = pAVar7;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if (local_2b8.data != (void *)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var3)) {
          lVar17 = *(long *)(&this->field_0x298 + (long)p_Var3);
          lVar5 = *(long *)(&this->field_0x288 + (long)p_Var3);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var3);
          plVar4 = *(long **)(&this->field_0x2a8 + (long)p_Var3);
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (long *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (**(code **)(*local_160 + 0x18))();
              }
            }
          }
          ppvVar12 = local_98;
          *(undefined8 *)((long)local_98 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar12 + 0x14) = 0;
          *ppvVar12 = (void *)0x0;
          ppvVar12[1] = (void *)0x0;
          puVar11 = local_a0;
          *local_a0 = 0;
          puVar11[1] = 0;
          *(undefined4 *)(puVar11 + 2) = 0;
          piStack_178 = (int *)0x0;
          local_158 = 0x100000001;
          uStack_150 = 0x100000001;
          local_148 = 1;
          local_140 = 1;
          local_180 = (void *)(lVar17 * lVar23 + lVar5);
          lStack_170 = lVar17;
          uStack_168 = uVar1;
          local_160 = plVar4;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar16->_vptr_Layer[3])(pLVar16,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar17 = 0xd8;
        do {
          piVar6 = *(int **)(local_258 + lVar17 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_258 + lVar17 + 0x20) == (long *)0x0) {
                if (*(void **)(local_258 + lVar17) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar17));
                }
              }
              else {
                (**(code **)(**(long **)(local_258 + lVar17 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar17) = 0;
          *(undefined8 *)(local_258 + lVar17 + 0xc) = 0;
          *(undefined8 *)(local_258 + lVar17 + 0x14) = 0;
          *(undefined8 *)(local_258 + lVar17) = 0;
          *(undefined8 *)(local_258 + lVar17 + 8) = 0;
          *(undefined8 *)(local_258 + lVar17 + 0x28) = 0;
          *(undefined8 *)((long)local_220 + lVar17 + -8) = 0;
          *(undefined4 *)((long)local_220 + lVar17) = 0;
          lVar17 = lVar17 + -0x48;
        } while (lVar17 != -0x48);
      }
      else {
        lVar17 = 0x40;
        do {
          *(undefined8 *)(local_258 + lVar17) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x28) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x20) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x1c) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -0x14) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + -8) = 0;
          *(undefined8 *)(auStack_270 + lVar17) = 0;
          *(undefined8 *)(auStack_270 + lVar17 + 4) = 0;
          *(undefined8 *)((long)&local_264 + lVar17) = 0;
          lVar17 = lVar17 + 0x48;
        } while (lVar17 != 0x1a8);
        piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
              if ((void *)local_258._0_8_ != (void *)0x0) {
                free((void *)local_258._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_258._32_8_)[3])();
            }
          }
        }
        local_258._0_8_ = local_e8.data;
        local_258._8_4_ = local_e8.refcount._0_4_;
        local_258._12_4_ = local_e8.refcount._4_4_;
        local_258._16_4_ = (undefined4)local_e8.elemsize;
        local_258._20_4_ = local_e8.elemsize._4_4_;
        local_258._24_4_ = local_e8.elempack;
        local_258._32_8_ = local_e8.allocator;
        uStack_228._0_4_ = local_e8.h;
        local_258._40_4_ = local_e8.dims;
        iStack_22c = local_e8.w;
        uStack_228._4_4_ = local_e8.d;
        local_220[0] = local_e8.c;
        local_218 = local_e8.cstep;
        piVar6 = (int *)CONCAT44(uStack_204,uStack_208);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1f0 == (Allocator *)0x0) {
              if (local_210 != (void *)0x0) {
                free(local_210);
              }
            }
            else {
              (*local_1f0->_vptr_Allocator[3])();
            }
          }
        }
        uStack_208 = 0;
        uStack_204 = 0;
        uStack_200 = (undefined4)local_68;
        uStack_1fc = (undefined4)((ulong)local_68 >> 0x20);
        iStack_1f8 = local_260;
        local_1f0 = local_70;
        _local_1e8 = CONCAT44(local_264,uVar14);
        uStack_1e0 = (ulong)CONCAT14(bVar24,uVar14);
        local_1d0 = local_78;
        local_210 = pvVar21;
        local_1d8 = uVar14;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) != 0) {
          local_2b8.cstep = 0;
          local_2b8.data = (_func_int **)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
          local_2b8.allocator = (Allocator *)0x0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          Mat::create(&local_2b8,i,4,(Allocator *)0x0);
          auVar10 = _DAT_0054cf10;
          auVar9 = _DAT_0054cf00;
          auVar8 = _DAT_0054ce00;
          uVar14 = local_2b8.c * (int)local_2b8.cstep;
          if (0 < (int)uVar14) {
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 + (long)this->_vptr_ConvolutionDepthWise_x86[-3])
                     + lVar23 * 4);
            lVar17 = (ulong)uVar14 - 1;
            auVar29._8_4_ = (int)lVar17;
            auVar29._0_8_ = lVar17;
            auVar29._12_4_ = (int)((ulong)lVar17 >> 0x20);
            uVar18 = 0;
            do {
              auVar27._8_4_ = (int)uVar18;
              auVar27._0_8_ = uVar18;
              auVar27._12_4_ = (int)(uVar18 >> 0x20);
              auVar30 = (auVar27 | auVar10) ^ auVar8;
              iVar25 = SUB164(auVar29 ^ auVar8,0);
              bVar24 = iVar25 < auVar30._0_4_;
              iVar26 = SUB164(auVar29 ^ auVar8,4);
              iVar19 = auVar30._4_4_;
              if ((bool)(~(iVar26 < iVar19 || iVar19 == iVar26 && bVar24) & 1)) {
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4) = uVar1;
              }
              if (iVar26 >= iVar19 && (iVar19 != iVar26 || !bVar24)) {
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4 + 4) = uVar1;
              }
              auVar30 = (auVar27 | auVar9) ^ auVar8;
              iVar19 = auVar30._4_4_;
              if (iVar19 <= iVar26 && (iVar19 != iVar26 || auVar30._0_4_ <= iVar25)) {
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4 + 8) = uVar1;
                *(undefined4 *)((long)local_2b8.data + uVar18 * 4 + 0xc) = uVar1;
              }
              uVar18 = uVar18 + 4;
            } while ((uVar14 + 3 & 0xfffffffc) != uVar18);
          }
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          if (piStack_1c0 != (int *)0x0) {
            LOCK();
            *piStack_1c0 = *piStack_1c0 + -1;
            UNLOCK();
            if (*piStack_1c0 == 0) {
              if (local_1a8 == (Allocator *)0x0) {
                if (local_1c8 != (_func_int **)0x0) {
                  free(local_1c8);
                }
              }
              else {
                (*local_1a8->_vptr_Allocator[3])();
              }
            }
          }
          ppp_Var13 = local_88;
          *(undefined8 *)((long)local_88 + 0xc) = 0;
          *(undefined8 *)((long)ppp_Var13 + 0x14) = 0;
          *ppp_Var13 = (_func_int **)0x0;
          ppp_Var13[1] = (_func_int **)0x0;
          piVar6 = local_90;
          piVar6[0] = 0;
          piVar6[1] = 0;
          piVar6[2] = 0;
          piVar6[3] = 0;
          piVar6[4] = 0;
          piStack_1c0 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          local_1c8 = (_func_int **)local_2b8.data;
          lStack_1b8 = CONCAT44(local_2b8.elemsize._4_4_,(undefined4)local_2b8.elemsize);
          iStack_1b0 = local_2b8.elempack;
          local_1a8 = local_2b8.allocator;
          local_1a0 = local_2b8.dims;
          iStack_19c = local_2b8.w;
          iStack_198 = local_2b8.h;
          iStack_194 = local_2b8.d;
          local_190 = local_2b8.c;
          local_188 = local_2b8.cstep;
          p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
          lVar17 = *(long *)(&this->field_0x250 + (long)p_Var3);
          pvVar21 = (void *)(lVar17 * lVar23 + *(long *)(&this->field_0x240 + (long)p_Var3));
          uVar1 = *(undefined4 *)(&this->field_0x258 + (long)p_Var3);
          plVar4 = *(long **)(&this->field_0x260 + (long)p_Var3);
          if (piStack_178 != (int *)0x0) {
            LOCK();
            *piStack_178 = *piStack_178 + -1;
            UNLOCK();
            if (*piStack_178 == 0) {
              if (local_160 == (long *)0x0) {
                if (local_180 != (void *)0x0) {
                  free(local_180);
                }
              }
              else {
                (**(code **)(*local_160 + 0x18))();
              }
            }
          }
          ppvVar12 = local_98;
          *(undefined8 *)((long)local_98 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar12 + 0x14) = 0;
          *ppvVar12 = (void *)0x0;
          ppvVar12[1] = (void *)0x0;
          puVar11 = local_a0;
          *local_a0 = 0;
          puVar11[1] = 0;
          *(undefined4 *)(puVar11 + 2) = 0;
          piStack_178 = (int *)0x0;
          local_158 = 0x100000001;
          uStack_150 = 0x100000001;
          local_148 = 1;
          local_140 = 1;
          piVar6 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
          local_180 = pvVar21;
          lStack_170 = lVar17;
          uStack_168 = uVar1;
          local_160 = plVar4;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2b8.allocator == (Allocator *)0x0) {
                if ((_func_int **)local_2b8.data != (_func_int **)0x0) {
                  free(local_2b8.data);
                }
              }
              else {
                (*(local_2b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8.cstep = 0;
          local_2b8.data = (void *)0x0;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0;
          local_2b8.elemsize._0_4_ = 0;
          local_2b8.elemsize._4_4_ = 0;
          local_2b8.elempack = 0;
          local_2b8.dims = 0;
          local_2b8.w = 0;
          local_2b8.h = 0;
          local_2b8.d = 0;
          local_2b8.c = 0;
        }
        p_Var3 = this->_vptr_ConvolutionDepthWise_x86[-3];
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var3)) {
          lVar17 = *(long *)(&this->field_0x298 + (long)p_Var3);
          lVar5 = *(long *)(&this->field_0x288 + (long)p_Var3);
          uVar1 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var3);
          plVar4 = *(long **)(&this->field_0x2a8 + (long)p_Var3);
          piVar6 = (int *)CONCAT44(uStack_12c,uStack_130);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_118 == (long *)0x0) {
                if (local_138 != (void *)0x0) {
                  free(local_138);
                }
              }
              else {
                (**(code **)(*local_118 + 0x18))();
              }
            }
          }
          uStack_130 = 0;
          uStack_12c = 0;
          uStack_128 = (undefined4)lVar17;
          uStack_124 = (undefined4)((ulong)lVar17 >> 0x20);
          local_110 = 0x100000001;
          uStack_108 = 0x100000001;
          local_100 = 1;
          local_f8 = 1;
          local_138 = (void *)(lVar17 * lVar23 + lVar5);
          uStack_120 = uVar1;
          local_118 = plVar4;
        }
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_2b8,(Mat *)local_258);
        (*pLVar16->_vptr_Layer[3])(pLVar16,&local_2b8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_2b8);
        lVar17 = 0x120;
        do {
          piVar6 = *(int **)(local_258 + lVar17 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_258 + lVar17 + 0x20) == (long *)0x0) {
                if (*(void **)(local_258 + lVar17) != (void *)0x0) {
                  free(*(void **)(local_258 + lVar17));
                }
              }
              else {
                (**(code **)(**(long **)(local_258 + lVar17 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_218 + lVar17) = 0;
          *(undefined8 *)(local_258 + lVar17 + 0xc) = 0;
          *(undefined8 *)(local_258 + lVar17 + 0x14) = 0;
          *(undefined8 *)(local_258 + lVar17) = 0;
          *(undefined8 *)(local_258 + lVar17 + 8) = 0;
          *(undefined8 *)(local_258 + lVar17 + 0x28) = 0;
          *(undefined8 *)((long)local_220 + lVar17 + -8) = 0;
          *(undefined4 *)((long)local_220 + lVar17) = 0;
          lVar17 = lVar17 + -0x48;
        } while (lVar17 != -0x48);
      }
      (*pLVar16->_vptr_Layer[4])(pLVar16,local_48);
      (local_80->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar23] = pLVar16;
      ParamDict::~ParamDict(&local_40);
      piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      lVar23 = lVar23 + 1;
      pp_Var22 = this->_vptr_ConvolutionDepthWise_x86;
    } while (lVar23 < *(int *)(&this->field_0x108 + (long)pp_Var22[-3]));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}